

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainInit.c
# Opt level: O1

void Abc_FrameAddInitializer(Abc_FrameInitializer_t *p)

{
  if (s_InitializerStart == (Abc_FrameInitializer_t *)0x0) {
    s_InitializerStart = p;
  }
  p->next = (Abc_FrameInitializer_t *)0x0;
  p->prev = s_InitializerEnd;
  if (s_InitializerEnd != (Abc_FrameInitializer_t *)0x0) {
    s_InitializerEnd->next = p;
  }
  s_InitializerEnd = p;
  return;
}

Assistant:

void Abc_FrameAddInitializer( Abc_FrameInitializer_t* p )
{
    if( ! s_InitializerStart )
        s_InitializerStart = p;

    p->next = NULL;
    p->prev = s_InitializerEnd;

    if ( s_InitializerEnd )
        s_InitializerEnd->next = p;

    s_InitializerEnd = p;

}